

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall spdlog::details::registry::drop(registry *this,string *logger_name)

{
  bool bVar1;
  __type_conflict1 _Var2;
  element_type *this_00;
  long in_RDI;
  bool is_default_logger;
  lock_guard<std::mutex> lock;
  key_type *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffd0;
  byte bVar3;
  undefined4 in_stack_ffffffffffffffd4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffc0,
             (mutex_type *)in_stack_ffffffffffffffb8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x130));
  in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 & 0xffffff;
  if (bVar1) {
    this_00 = CLI::std::
              __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5da563);
    in_stack_ffffffffffffffc0 = logger::name_abi_cxx11_(this_00);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffd0 = CONCAT13(_Var2,(int3)in_stack_ffffffffffffffd0);
  }
  bVar3 = (byte)(in_stack_ffffffffffffffd0 >> 0x18);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
           *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if ((bVar3 & 1) != 0) {
    CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5da5e2);
  return;
}

Assistant:

SPDLOG_INLINE void registry::drop(const std::string &logger_name) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    auto is_default_logger = default_logger_ && default_logger_->name() == logger_name;
    loggers_.erase(logger_name);
    if (is_default_logger) {
        default_logger_.reset();
    }
}